

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void object_suite::run(void)

{
  test_empty();
  test_empty2();
  test_one();
  test_many();
  test_nested_one();
  test_string_collector();
  fail_missing_colon();
  fail_missing_value();
  fail_trailing_separator();
  fail_invalid_integer_key();
  fail_invalid_null_key();
  fail_invalid_true_key();
  fail_invalid_object_key();
  fail_empty_mismatched();
  fail_one_mismatched();
  fail_outer();
  fail_missing_begin();
  fail_missing_begin_after_object();
  fail_missing_begin_after_comma();
  fail_missing_end();
  fail_concatenated_objects();
  fail_nested_concatenated_objects();
  return;
}

Assistant:

void run()
{
    test_empty();
    test_empty2();
    test_one();
    test_many();
    test_nested_one();
    test_string_collector();
    fail_missing_colon();
    fail_missing_value();
    fail_trailing_separator();
    fail_invalid_integer_key();
    fail_invalid_null_key();
    fail_invalid_true_key();
    fail_invalid_object_key();
    fail_empty_mismatched();
    fail_one_mismatched();
    fail_outer();
    fail_missing_begin();
    fail_missing_begin_after_object();
    fail_missing_begin_after_comma();
    fail_missing_end();
    fail_concatenated_objects();
    fail_nested_concatenated_objects();
}